

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

void __thiscall
HighsSplitDeque::WorkerBunk::publishWork(WorkerBunk *this,HighsSplitDeque *localDeque)

{
  atomic<unsigned_long> *paVar1;
  uint32_t uVar2;
  HighsSplitDeque *pHVar3;
  ulong uVar4;
  HighsSplitDeque *pHVar5;
  uint32_t uVar6;
  ulong uVar7;
  bool bVar8;
  
  pHVar3 = popSleeper(this,localDeque);
  while( true ) {
    if (pHVar3 == (HighsSplitDeque *)0x0) {
      return;
    }
    if ((localDeque->ownerData).allStolenCopy == true) break;
    LOCK();
    paVar1 = &(localDeque->stealerData).ts;
    uVar4 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 0x100000000;
    UNLOCK();
    uVar7 = uVar4 >> 0x20;
    uVar6 = (uint32_t)(uVar4 >> 0x20);
    if ((localDeque->ownerData).splitCopy == uVar6) {
      (localDeque->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
           uVar4 & 0xffffffff00000000 | uVar7;
      goto LAB_00223941;
    }
    ((StealerData *)((long)pHVar3 + 0x88))->semaphore =
         (HighsBinarySemaphore)((localDeque->taskArray)._M_elems + uVar7);
    HighsBinarySemaphore::release((HighsBinarySemaphore *)((long)pHVar3 + 0x80));
    uVar2 = (localDeque->ownerData).splitCopy;
    if (uVar2 - 1 == uVar6) {
      if ((localDeque->ownerData).head != uVar2) {
        return;
      }
      (localDeque->ownerData).allStolenCopy = true;
      (localDeque->stealerData).allStolen._M_base._M_i = true;
      LOCK();
      (this->haveJobs).super___atomic_base<int>._M_i =
           (this->haveJobs).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      return;
    }
    pHVar3 = popSleeper(this,localDeque);
  }
  uVar7 = (ulong)(localDeque->ownerData).splitCopy;
LAB_00223941:
  if ((localDeque->ownerData).head == (uint32_t)uVar7) {
    (localDeque->ownerData).allStolenCopy = true;
    (localDeque->stealerData).allStolen._M_base._M_i = true;
    LOCK();
    (this->haveJobs).super___atomic_base<int>._M_i =
         (this->haveJobs).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  uVar7 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
  do {
    if ((uVar7 & 0xfffff) == 0) {
      pHVar5 = (HighsSplitDeque *)0x0;
    }
    else {
      pHVar5 = (*(unique_ptr<HighsSplitDeque> **)&((OwnerData *)((long)pHVar3 + 0x10))->workerBunk)
               [(uVar7 & 0xfffff) - 1]._M_t.
               super___uniq_ptr_impl<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsSplitDeque_*,_highs::cache_aligned::Deleter<HighsSplitDeque>_>
               .super__Head_base<0UL,_HighsSplitDeque_*,_false>._M_head_impl;
    }
    ((WorkerBunkData *)((long)pHVar3 + 0xc0))->nextSleeper = (atomic<HighsSplitDeque_*>)pHVar5;
    LOCK();
    uVar4 = (this->sleeperStack).super___atomic_base<unsigned_long>._M_i;
    bVar8 = uVar7 == uVar4;
    if (bVar8) {
      (this->sleeperStack).super___atomic_base<unsigned_long>._M_i =
           (long)*(int *)&((WorkerBunkData *)((long)pHVar3 + 200))->nextSleeper + 1U |
           (uVar7 & 0xfffffffffff00000) + 0x100000;
      uVar4 = uVar7;
    }
    UNLOCK();
    uVar7 = uVar4;
  } while (!bVar8);
  return;
}

Assistant:

void publishWork(HighsSplitDeque* localDeque) {
      HighsSplitDeque* sleeper = popSleeper(localDeque);
      while (sleeper) {
        uint32_t t = localDeque->selfStealAndGetTail();
        if (t == localDeque->ownerData.splitCopy) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          pushSleeper(sleeper);
          return;
        } else {
          sleeper->injectTaskAndNotify(&localDeque->taskArray[t]);
        }

        if (t == localDeque->ownerData.splitCopy - 1) {
          if (localDeque->ownerData.head == localDeque->ownerData.splitCopy) {
            localDeque->ownerData.allStolenCopy = true;
            localDeque->stealerData.allStolen.store(true,
                                                    std::memory_order_relaxed);
            haveJobs.fetch_add(-1, std::memory_order_release);
          }
          return;
        }

        sleeper = popSleeper(localDeque);
      }
    }